

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::FboStateQueryTests::init(FboStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  Context *context;
  int extraout_EAX;
  long *plVar2;
  ApiCase *pAVar3;
  long *plVar4;
  long lVar5;
  allocator<char> local_81;
  ApiCase *local_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  TestNode *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  lVar5 = 0;
  local_58 = (TestNode *)this;
  do {
    local_80 = (ApiCase *)operator_new(0xa0);
    context = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,*(char **)((long)&PTR_anon_var_dwarf_2bb6197_02189db0 + lVar5),
               &local_81);
    plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
    pAVar3 = local_80;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_68 = *plVar4;
      lStack_60 = plVar2[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar4;
      local_78 = (long *)*plVar2;
    }
    local_70 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    uVar1 = *(undefined4 *)((long)&DAT_02189db8 + lVar5);
    ApiCase::ApiCase(local_80,context,(char *)local_78,"default framebuffer");
    this = (FboStateQueryTests *)local_58;
    (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_02189df8;
    *(undefined4 *)&pAVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
    tcu::TestNode::addChild(local_58,(TestNode *)pAVar3);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 == 0x10);
  pAVar3 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   "framebuffer_attachment_object",
                   "FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE and FRAMEBUFFER_ATTACHMENT_OBJECT_NAME");
  (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_02189e50;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   "framebuffer_attachment_texture_level","FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL");
  (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_02189ea8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   "framebuffer_attachment_texture_cube_map_face",
                   "FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE");
  (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_02189f00;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   "framebuffer_attachment_texture_layer","FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER");
  (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_02189f58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   "framebuffer_attachment_color_encoding","FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING");
  (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_02189fb0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   "framebuffer_attachment_component_type","FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE");
  (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0218a008;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   "framebuffer_attachment_x_size_initial","FRAMEBUFFER_ATTACHMENT_x_SIZE");
  (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0218a060;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   "framebuffer_attachment_x_size_rbo","FRAMEBUFFER_ATTACHMENT_x_SIZE");
  (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0218a0b8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   "framebuffer_attachment_x_size_texture","FRAMEBUFFER_ATTACHMENT_x_SIZE");
  (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0218a138;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   "framebuffer_unspecified_attachment_color_encoding",
                   "FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING");
  (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0218a1a0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   "framebuffer_unspecified_attachment_component_type",
                   "FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE");
  (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0218a1f8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   "framebuffer_unspecified_attachment_x_size_rbo","FRAMEBUFFER_ATTACHMENT_x_SIZE");
  (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0218a250;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   "framebuffer_unspecified_attachment_x_size_texture",
                   "FRAMEBUFFER_ATTACHMENT_x_SIZE");
  (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0218a2d0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  return extraout_EAX;
}

Assistant:

void FboStateQueryTests::init (void)
{
	const struct FramebufferTarget
	{
		const char*	name;
		GLenum		target;
	} fboTargets[] =
	{
		{ "draw_framebuffer_", GL_DRAW_FRAMEBUFFER },
		{ "read_framebuffer_", GL_READ_FRAMEBUFFER }
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(fboTargets); ++ndx)
		addChild(new DefaultFramebufferCase(m_context, (std::string(fboTargets[ndx].name) + "default_framebuffer").c_str(), "default framebuffer", fboTargets[ndx].target));

	addChild(new AttachmentObjectCase							(m_context, "framebuffer_attachment_object",							"FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE and FRAMEBUFFER_ATTACHMENT_OBJECT_NAME"));
	addChild(new AttachmentTextureLevelCase						(m_context, "framebuffer_attachment_texture_level",						"FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL"));
	addChild(new AttachmentTextureCubeMapFaceCase				(m_context, "framebuffer_attachment_texture_cube_map_face",				"FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE"));
	addChild(new AttachmentTextureLayerCase						(m_context, "framebuffer_attachment_texture_layer",						"FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER"));
	addChild(new AttachmentTextureColorCodingCase				(m_context, "framebuffer_attachment_color_encoding",					"FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING"));
	addChild(new AttachmentTextureComponentTypeCase				(m_context, "framebuffer_attachment_component_type",					"FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE"));
	addChild(new AttachmentSizeInitialCase						(m_context, "framebuffer_attachment_x_size_initial",					"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
	addChild(new AttachmentSizeRboCase							(m_context, "framebuffer_attachment_x_size_rbo",						"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
	addChild(new AttachmentSizeTextureCase						(m_context, "framebuffer_attachment_x_size_texture",					"FRAMEBUFFER_ATTACHMENT_x_SIZE"));

	addChild(new UnspecifiedAttachmentTextureColorCodingCase	(m_context, "framebuffer_unspecified_attachment_color_encoding",		"FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING"));
	addChild(new UnspecifiedAttachmentTextureComponentTypeCase	(m_context, "framebuffer_unspecified_attachment_component_type",		"FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE"));
	addChild(new UnspecifiedAttachmentSizeRboCase				(m_context, "framebuffer_unspecified_attachment_x_size_rbo",			"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
	addChild(new UnspecifiedAttachmentSizeTextureCase			(m_context, "framebuffer_unspecified_attachment_x_size_texture",		"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
}